

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O2

void h262_print_picparm(h262_picparm *picparm)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  uint32_t (*pauVar6) [2];
  ulong uVar7;
  
  puts("Picture header:");
  printf("\ttemporal_reference = %d\n",(ulong)picparm->temporal_reference);
  bVar1 = true;
  switch(picparm->picture_coding_type) {
  case 1:
    pcVar4 = "I";
    break;
  case 2:
    pcVar4 = "P";
    bVar2 = false;
    goto LAB_001050b6;
  case 3:
    pcVar4 = "B";
    bVar2 = false;
    bVar1 = false;
    goto LAB_001050b6;
  case 4:
    pcVar4 = "D";
    break;
  default:
    pcVar4 = "???";
  }
  bVar2 = true;
LAB_001050b6:
  printf("\tpicture_coding_type = %d [%s]\n",(ulong)picparm->picture_coding_type,pcVar4);
  printf("\tvbv_delay = %d\n",(ulong)picparm->vbv_delay);
  if (!bVar2) {
    printf("\tfull_pel_forward_vector = %d\n",(ulong)picparm->full_pel_forward_vector);
    printf("\tforward_f_code = %d\n",(ulong)picparm->forward_f_code);
  }
  if (!bVar1) {
    printf("\tfull_pel_backward_vector = %d\n",(ulong)picparm->full_pel_backward_vector);
    printf("\tbackward_f_code = %d\n",(ulong)picparm->backward_f_code);
  }
  if (picparm->is_ext != 0) {
    pauVar6 = picparm->f_code;
    for (uVar7 = 0; uVar7 != 2; uVar7 = uVar7 + 1) {
      for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
        printf("\tf_code[%d][%d] = %d\n",uVar7 & 0xffffffff,uVar5 & 0xffffffff,
               (ulong)(*pauVar6)[uVar5]);
      }
      pauVar6 = pauVar6 + 1;
    }
    printf("\tintra_dc_precision = %d\n",(ulong)picparm->intra_dc_precision);
    uVar3 = picparm->picture_structure - 1;
    if (uVar3 < 3) {
      pcVar4 = &DAT_00118058 + *(int *)(&DAT_00118058 + (ulong)uVar3 * 4);
    }
    else {
      pcVar4 = "???";
    }
    printf("\tpicture_structure = %d [%s]\n",(ulong)picparm->picture_structure,pcVar4);
    printf("\ttop_field_first = %d\n",(ulong)picparm->top_field_first);
    printf("\tframe_pred_frame_dct = %d\n",(ulong)picparm->frame_pred_frame_dct);
    printf("\tconcealment_motion_vectors = %d\n",(ulong)picparm->concealment_motion_vectors);
    printf("\tq_scale_type = %d\n",(ulong)picparm->q_scale_type);
    printf("\tintra_vlc_format = %d\n",(ulong)picparm->intra_vlc_format);
    printf("\talternate_scan = %d\n",(ulong)picparm->alternate_scan);
    printf("\trepeat_first_field = %d\n",(ulong)picparm->repeat_first_field);
    printf("\tchroma_420_type = %d\n",(ulong)picparm->chroma_420_type);
    printf("\tprogressive_frame = %d\n",(ulong)picparm->progressive_frame);
    printf("\tcomposite_display_flag = %d\n",(ulong)picparm->composite_display_flag);
    if (picparm->composite_display_flag != 0) {
      printf("\tv_axis = %d\n",(ulong)picparm->v_axis);
      printf("\tfield_sequence = %d\n",(ulong)picparm->field_sequence);
      printf("\tsub_carrier = %d\n",(ulong)picparm->sub_carrier);
      printf("\tburst_amplitude = %d\n",(ulong)picparm->burst_amplitude);
      printf("\tsub_carrier_phase = %d\n",(ulong)picparm->sub_carrier_phase);
      return;
    }
  }
  return;
}

Assistant:

void h262_print_picparm(struct h262_picparm *picparm) {
	int f = 0, b = 0;
	const char *pctstr = "???";
	printf("Picture header:\n");
	printf("\ttemporal_reference = %d\n", picparm->temporal_reference);
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			pctstr = "I";
			break;
		case H262_PIC_TYPE_P:
			pctstr = "P";
			f = 1;
			break;
		case H262_PIC_TYPE_B:
			pctstr = "B";
			f = b = 1;
			break;
		case H262_PIC_TYPE_D:
			pctstr = "D";
			break;
	}
	printf("\tpicture_coding_type = %d [%s]\n", picparm->picture_coding_type, pctstr);
	printf("\tvbv_delay = %d\n", picparm->vbv_delay);
	if (f) {
		printf("\tfull_pel_forward_vector = %d\n", picparm->full_pel_forward_vector);
		printf("\tforward_f_code = %d\n", picparm->forward_f_code);
	}
	if (b) {
		printf("\tfull_pel_backward_vector = %d\n", picparm->full_pel_backward_vector);
		printf("\tbackward_f_code = %d\n", picparm->backward_f_code);
	}
	if (picparm->is_ext) {
		int i, j;
		for (i = 0; i < 2; i++)
			for (j = 0; j < 2; j++)
				printf("\tf_code[%d][%d] = %d\n", i, j, picparm->f_code[i][j]);
		printf("\tintra_dc_precision = %d\n", picparm->intra_dc_precision);
		const char *ps = "???";
		switch (picparm->picture_structure) {
			case H262_PIC_STRUCT_FIELD_TOP:
				ps = "top field";
				break;
			case H262_PIC_STRUCT_FIELD_BOTTOM:
				ps = "bottom field";
				break;
			case H262_PIC_STRUCT_FRAME:
				ps = "frame";
				break;
		}
		printf("\tpicture_structure = %d [%s]\n", picparm->picture_structure, ps);
		printf("\ttop_field_first = %d\n", picparm->top_field_first);
		printf("\tframe_pred_frame_dct = %d\n", picparm->frame_pred_frame_dct);
		printf("\tconcealment_motion_vectors = %d\n", picparm->concealment_motion_vectors);
		printf("\tq_scale_type = %d\n", picparm->q_scale_type);
		printf("\tintra_vlc_format = %d\n", picparm->intra_vlc_format);
		printf("\talternate_scan = %d\n", picparm->alternate_scan);
		printf("\trepeat_first_field = %d\n", picparm->repeat_first_field);
		printf("\tchroma_420_type = %d\n", picparm->chroma_420_type);
		printf("\tprogressive_frame = %d\n", picparm->progressive_frame);
		printf("\tcomposite_display_flag = %d\n", picparm->composite_display_flag);
		if (picparm->composite_display_flag) {
			printf("\tv_axis = %d\n", picparm->v_axis);
			printf("\tfield_sequence = %d\n", picparm->field_sequence);
			printf("\tsub_carrier = %d\n", picparm->sub_carrier);
			printf("\tburst_amplitude = %d\n", picparm->burst_amplitude);
			printf("\tsub_carrier_phase = %d\n", picparm->sub_carrier_phase);
		}
	}
}